

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O3

FT_Error FT_Outline_Render(FT_Library library,FT_Outline *outline,FT_Raster_Params *params)

{
  FT_Renderer_conflict pFVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  FT_ListRec *pFVar5;
  FT_ListNode pFVar6;
  
  if (library == (FT_Library)0x0) {
    iVar4 = 0x21;
  }
  else if (outline == (FT_Outline *)0x0) {
    iVar4 = 0x14;
  }
  else if (params == (FT_Raster_Params *)0x0) {
    iVar4 = 6;
  }
  else {
    pFVar6 = (library->renderers).head;
    pFVar1 = library->cur_renderer;
    params->source = outline;
    if (pFVar1 == (FT_Renderer_conflict)0x0) {
      iVar4 = 0x13;
    }
    else {
      iVar3 = (*pFVar1->raster_render)(pFVar1->raster,params);
      iVar4 = 0;
      if (iVar3 != 0) {
        iVar4 = iVar3;
        while ((char)iVar4 == '\x13') {
          pFVar5 = (FT_ListRec *)&pFVar6->next;
          if (pFVar6 == (FT_ListNode)0x0) {
            pFVar5 = &library->renderers;
          }
          pFVar6 = pFVar5->head;
          while( true ) {
            if (pFVar6 == (FT_ListNode)0x0) {
              return iVar4;
            }
            pvVar2 = pFVar6->data;
            if (*(int *)((long)pvVar2 + 0x20) == 0x6f75746c) break;
            pFVar6 = pFVar6->next;
          }
          iVar4 = (**(code **)((long)pvVar2 + 0x70))(*(undefined8 *)((long)pvVar2 + 0x68),params);
          if (iVar4 == 0) {
            return 0;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Render( FT_Library         library,
                     FT_Outline*        outline,
                     FT_Raster_Params*  params )
  {
    FT_Error     error;
    FT_Renderer  renderer;
    FT_ListNode  node;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !params )
      return FT_THROW( Invalid_Argument );

    renderer = library->cur_renderer;
    node     = library->renderers.head;

    params->source = (void*)outline;

    error = FT_ERR( Cannot_Render_Glyph );
    while ( renderer )
    {
      error = renderer->raster_render( renderer->raster, params );
      if ( !error || FT_ERR_NEQ( error, Cannot_Render_Glyph ) )
        break;

      /* FT_Err_Cannot_Render_Glyph is returned if the render mode   */
      /* is unsupported by the current renderer for this glyph image */
      /* format                                                      */

      /* now, look for another renderer that supports the same */
      /* format                                                */
      renderer = FT_Lookup_Renderer( library, FT_GLYPH_FORMAT_OUTLINE,
                                     &node );
    }

    return error;
  }